

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_read_public(mbedtls_dhm_context *ctx,uchar *input,size_t ilen)

{
  int iVar1;
  int ret;
  size_t ilen_local;
  uchar *input_local;
  mbedtls_dhm_context *ctx_local;
  
  if (((ctx == (mbedtls_dhm_context *)0x0) || (ilen == 0)) || (ctx->len < ilen)) {
    ctx_local._4_4_ = -0x3080;
  }
  else {
    iVar1 = mbedtls_mpi_read_binary(&ctx->GY,input,ilen);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      ctx_local._4_4_ = iVar1 + -0x3200;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_dhm_read_public( mbedtls_dhm_context *ctx,
                     const unsigned char *input, size_t ilen )
{
    int ret;

    if( ctx == NULL || ilen < 1 || ilen > ctx->len )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( ( ret = mbedtls_mpi_read_binary( &ctx->GY, input, ilen ) ) != 0 )
        return( MBEDTLS_ERR_DHM_READ_PUBLIC_FAILED + ret );

    return( 0 );
}